

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

void __thiscall Assimp::XFileParser::ParseDataObjectMeshNormals(XFileParser *this,Mesh *pMesh)

{
  pointer paVar1;
  pointer pFVar2;
  void *pvVar3;
  pointer puVar4;
  uint uVar5;
  uint uVar6;
  vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_> *this_00;
  long lVar7;
  ulong __new_size;
  uint a;
  ulong uVar8;
  aiVector3D aVar9;
  string local_50;
  
  readHeadOfDataObject(this,(string *)0x0);
  uVar5 = ReadInt(this);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (&pMesh->mNormals,(ulong)uVar5);
  if (uVar5 != 0) {
    lVar7 = 0;
    do {
      aVar9 = ReadVector3(this);
      paVar1 = (pMesh->mNormals).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(long *)((long)&paVar1->x + lVar7) = aVar9._0_8_;
      *(float *)((long)&paVar1->z + lVar7) = aVar9.z;
      lVar7 = lVar7 + 0xc;
    } while ((ulong)uVar5 * 0xc != lVar7);
  }
  uVar5 = ReadInt(this);
  __new_size = (ulong)uVar5;
  if (((long)(pMesh->mPosFaces).
             super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(pMesh->mPosFaces).
             super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size == 0) {
    if (__new_size != 0) {
      this_00 = &pMesh->mNormFaces;
      std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::resize
                (this_00,__new_size);
      uVar8 = 0;
      do {
        uVar5 = ReadInt(this);
        pFVar2 = (this_00->
                 super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pvVar3 = *(void **)&pFVar2[uVar8].mIndices.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
        puVar4 = *(pointer *)
                  ((long)&pFVar2[uVar8].mIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                  0x10);
        *(undefined8 *)
         &pFVar2[uVar8].mIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl = 0;
        *(pointer *)
         ((long)&pFVar2[uVar8].mIndices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) =
             (pointer)0x0;
        *(pointer *)
         ((long)&pFVar2[uVar8].mIndices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 0x10) =
             (pointer)0x0;
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,(long)puVar4 - (long)pvVar3);
        }
        if (uVar5 != 0) {
          pFVar2 = (this_00->
                   super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            uVar6 = ReadInt(this);
            local_50._M_dataplus._M_p._0_4_ = uVar6;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&pFVar2[uVar8].mIndices,(uint *)&local_50);
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        TestForSeparator(this);
        uVar8 = uVar8 + 1;
      } while (uVar8 != __new_size);
    }
    CheckForClosingBrace(this);
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Normal face count does not match vertex face count.","");
  ThrowException(this,&local_50);
}

Assistant:

void XFileParser::ParseDataObjectMeshNormals( Mesh* pMesh)
{
    readHeadOfDataObject();

    // read count
    unsigned int numNormals = ReadInt();
    pMesh->mNormals.resize( numNormals);

    // read normal vectors
    for( unsigned int a = 0; a < numNormals; ++a) {
        pMesh->mNormals[a] = ReadVector3();
    }

    // read normal indices
    unsigned int numFaces = ReadInt();
    if( numFaces != pMesh->mPosFaces.size()) {
        ThrowException( "Normal face count does not match vertex face count.");
    }

    // do not crah when no face definitions are there
    if (numFaces > 0) {
        // normal face creation
        pMesh->mNormFaces.resize( numFaces );
        for( unsigned int a = 0; a < numFaces; ++a ) {
            unsigned int numIndices = ReadInt();
            pMesh->mNormFaces[a] = Face();
            Face& face = pMesh->mNormFaces[a];
            for( unsigned int b = 0; b < numIndices; ++b ) {
                face.mIndices.push_back( ReadInt());
            }

            TestForSeparator();
        }
    }

    CheckForClosingBrace();
}